

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVector<ImGuiWindow_*> *this_00;
  ImVec2 IVar1;
  uint move_flags;
  _func_void_int_int *p_Var2;
  char *text;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  ImGuiKeyModFlags IVar8;
  int iVar9;
  ImGuiWindow *pIVar10;
  ImGuiWindow **ppIVar11;
  char *pcVar12;
  ImGuiContext *g;
  int i;
  int iVar13;
  ImGuiDir clip_dir;
  char *label;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ImRect local_48;
  
  pIVar5 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1063,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1068,"void ImGui::EndFrame()");
  }
  IVar8 = GetMergedKeyModFlags();
  if ((pIVar5->IO).KeyMods != IVar8) {
    __assert_fail("g.IO.KeyMods == expected_key_mod_flags && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1ab3,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  iVar13 = (pIVar5->CurrentWindowStack).Size;
  if (iVar13 != 1) {
    if (1 < iVar13) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1abc,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1ac2,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  p_Var2 = (pIVar5->IO).ImeSetInputScreenPosFn;
  if (p_Var2 != (_func_void_int_int *)0x0) {
    fVar17 = (pIVar5->PlatformImeLastPos).x;
    if ((fVar17 != 3.4028235e+38) || (NAN(fVar17))) {
      fVar16 = (pIVar5->PlatformImePos).x;
      fVar15 = (pIVar5->PlatformImePos).y;
      fVar18 = (pIVar5->PlatformImeLastPos).y - fVar15;
      if ((fVar17 - fVar16) * (fVar17 - fVar16) + fVar18 * fVar18 <= 0.0001) goto LAB_00150bb1;
    }
    else {
      fVar16 = (pIVar5->PlatformImePos).x;
      fVar15 = (pIVar5->PlatformImePos).y;
    }
    (*p_Var2)((int)fVar16,(int)fVar15);
    pIVar5->PlatformImeLastPos = pIVar5->PlatformImePos;
  }
LAB_00150bb1:
  pIVar5->WithinFrameScopeWithImplicitWindow = false;
  pIVar10 = pIVar5->CurrentWindow;
  if ((pIVar10 != (ImGuiWindow *)0x0) && (pIVar10->WriteAccessed == false)) {
    pIVar10->Active = false;
  }
  End();
  pIVar4 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      pIVar10 = FindWindowByName("###NavWindowingList");
      pIVar4->NavWindowingListWindow = pIVar10;
    }
    IVar1 = (pIVar4->IO).DisplaySize;
    fVar17 = IVar1.x;
    fVar16 = IVar1.y;
    IVar3.y = fVar16 * 0.2;
    IVar3.x = fVar17 * 0.2;
    (pIVar4->NextWindowData).SizeConstraintRect.Min = IVar3;
    (pIVar4->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar4->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar4->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar4->NextWindowData).SizeCallbackUserData = (void *)0x0;
    *(byte *)&(pIVar4->NextWindowData).Flags = (byte)(pIVar4->NextWindowData).Flags | 0x11;
    IVar1.y = fVar16 * 0.5;
    IVar1.x = fVar17 * 0.5;
    (pIVar4->NextWindowData).PosVal = IVar1;
    (pIVar4->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar4->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar4->NextWindowData).PosCond = 1;
    IVar1 = (pIVar4->Style).WindowPadding;
    fVar17 = IVar1.x;
    fVar16 = IVar1.y;
    local_48.Min.y = fVar16 + fVar16;
    local_48.Min.x = fVar17 + fVar17;
    PushStyleVar(1,&local_48.Min);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    iVar13 = (pIVar4->WindowsFocusOrder).Size;
    while (0 < iVar13) {
      iVar13 = iVar13 + -1;
      ppIVar11 = ImVector<ImGuiWindow_*>::operator[](&pIVar4->WindowsFocusOrder,iVar13);
      pIVar10 = *ppIVar11;
      bVar6 = IsWindowNavFocusable(pIVar10);
      if (bVar6) {
        text = pIVar10->Name;
        pcVar12 = FindRenderedTextEnd(text,(char *)0x0);
        label = text;
        if (text == pcVar12) {
          label = "(Popup)";
          if (((uint)pIVar10->Flags >> 0x1a & 1) == 0) {
            if (((uint)pIVar10->Flags >> 10 & 1) != 0) {
              iVar9 = strcmp(text,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar9 == 0) goto LAB_00150d2c;
            }
            label = "(Untitled)";
          }
        }
LAB_00150d2c:
        local_48.Min.x = 0.0;
        local_48.Min.y = 0.0;
        Selectable(label,pIVar4->NavWindowingTarget == pIVar10,0,&local_48.Min);
      }
    }
    End();
    PopStyleVar(1);
  }
  pIVar10 = pIVar4->NavWrapRequestWindow;
  if ((pIVar10 != (ImGuiWindow *)0x0) && (pIVar4->NavWindow == pIVar10)) {
    move_flags = pIVar4->NavWrapRequestFlags;
    bVar6 = NavMoveRequestButNoResultYet();
    if ((bVar6) &&
       ((pIVar4->NavMoveRequestForward == ImGuiNavForward_None &&
        (pIVar4->NavLayer == ImGuiNavLayer_Main)))) {
      if (move_flags == 0) {
        __assert_fail("move_flags != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                      ,0x22a6,"void ImGui::NavEndFrame()");
      }
      local_48.Min = pIVar10->NavRectRel[0].Min;
      local_48.Max = pIVar10->NavRectRel[0].Max;
      iVar13 = pIVar4->NavMoveDir;
      clip_dir = iVar13;
      if (iVar13 == 0) {
        if ((move_flags & 5) != 0) {
          fVar17 = (pIVar10->SizeFull).x;
          fVar16 = (pIVar10->WindowPadding).x;
          fVar16 = fVar16 + fVar16 + (pIVar10->ContentSize).x;
          uVar14 = -(uint)(fVar16 <= fVar17);
          fVar17 = (float)(uVar14 & (uint)fVar17 | ~uVar14 & (uint)fVar16) - (pIVar10->Scroll).x;
          clip_dir = 0;
          if ((move_flags & 4) != 0) {
            clip_dir = 2;
            fVar16 = local_48.Max.y - local_48.Min.y;
            local_48.Min.y = local_48.Min.y - fVar16;
            local_48.Max.y = local_48.Max.y - fVar16;
          }
          local_48.Max.x = fVar17;
          local_48.Min.x = fVar17;
          NavMoveRequestForward(0,clip_dir,&local_48,move_flags);
          iVar13 = pIVar4->NavMoveDir;
          goto LAB_00150e5b;
        }
        iVar13 = 0;
        clip_dir = 0;
      }
      else {
LAB_00150e5b:
        if (iVar13 == 1 && (move_flags & 5) != 0) {
          fVar17 = (pIVar10->Scroll).x;
          fVar15 = local_48.Max.y;
          local_48.Max = (ImVec2)(CONCAT44(local_48.Max.y,fVar17) ^ 0x80000000);
          fVar16 = local_48.Min.y;
          local_48.Min = (ImVec2)(CONCAT44(local_48.Min.y,fVar17) ^ 0x80000000);
          if ((move_flags & 4) != 0) {
            fVar17 = fVar15 - fVar16;
            local_48.Min.y = fVar16 + fVar17;
            local_48.Max.y = fVar17 + fVar15;
            clip_dir = 3;
          }
          NavMoveRequestForward(1,clip_dir,&local_48,move_flags);
          iVar13 = pIVar4->NavMoveDir;
        }
      }
      if ((move_flags & 10) != 0 && iVar13 == 2) {
        fVar17 = (pIVar10->SizeFull).y;
        fVar16 = (pIVar10->WindowPadding).y;
        fVar16 = fVar16 + fVar16 + (pIVar10->ContentSize).y;
        uVar14 = -(uint)(fVar16 <= fVar17);
        fVar17 = (float)(uVar14 & (uint)fVar17 | ~uVar14 & (uint)fVar16) - (pIVar10->Scroll).y;
        if ((move_flags & 8) != 0) {
          fVar16 = local_48.Max.x - local_48.Min.x;
          local_48.Min.x = local_48.Min.x - fVar16;
          local_48.Max.x = local_48.Max.x - fVar16;
          clip_dir = 0;
        }
        local_48.Max.y = fVar17;
        local_48.Min.y = fVar17;
        NavMoveRequestForward(2,clip_dir,&local_48,move_flags);
        iVar13 = pIVar4->NavMoveDir;
      }
      if (iVar13 == 3 && (move_flags & 10) != 0) {
        fVar17 = (pIVar10->Scroll).y;
        fVar15 = local_48.Max.x;
        local_48.Max = (ImVec2)(CONCAT44(fVar17,local_48.Max.x) ^ 0x8000000000000000);
        fVar16 = local_48.Min.x;
        local_48.Min = (ImVec2)(CONCAT44(fVar17,local_48.Min.x) ^ 0x8000000000000000);
        if ((move_flags & 8) != 0) {
          clip_dir = 1;
          fVar17 = fVar15 - fVar16;
          local_48.Min.x = fVar16 + fVar17;
          local_48.Max.x = fVar17 + fVar15;
        }
        NavMoveRequestForward(3,clip_dir,&local_48,move_flags);
      }
    }
  }
  if (pIVar5->DragDropActive != true) goto LAB_0015101e;
  bVar6 = (pIVar5->DragDropPayload).Delivery;
  if ((pIVar5->DragDropPayload).DataFrameCount + 1 < pIVar5->FrameCount) {
    if ((pIVar5->DragDropSourceFlags & 0x20) == 0) {
      bVar7 = IsMouseDown(pIVar5->DragDropMouseButton);
      bVar7 = !bVar7;
      goto LAB_00151011;
    }
  }
  else {
    bVar7 = false;
LAB_00151011:
    if ((!bVar7) && (bVar6 == false)) goto LAB_0015101e;
  }
  ClearDragDrop();
LAB_0015101e:
  iVar13 = pIVar5->FrameCount;
  if (((pIVar5->DragDropActive == true) && (pIVar5->DragDropSourceFrameCount < iVar13)) &&
     ((pIVar5->DragDropSourceFlags & 1) == 0)) {
    pIVar5->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar5->DragDropWithinSource = false;
    iVar13 = pIVar5->FrameCount;
  }
  pIVar5->WithinFrameScope = false;
  pIVar5->FrameCountEnded = iVar13;
  UpdateMouseMovingWindowEndFrame();
  this = &pIVar5->WindowsTempSortBuffer;
  ImVector<ImGuiWindow_*>::resize(this,0);
  this_00 = &pIVar5->Windows;
  ImVector<ImGuiWindow_*>::reserve(this,(pIVar5->Windows).Size);
  for (iVar13 = 0; iVar13 != this_00->Size; iVar13 = iVar13 + 1) {
    ppIVar11 = ImVector<ImGuiWindow_*>::operator[](this_00,iVar13);
    pIVar10 = *ppIVar11;
    if ((pIVar10->Active != true) || ((pIVar10->Flags & 0x1000000) == 0)) {
      AddWindowToSortBuffer(this,pIVar10);
    }
  }
  if (this->Size == iVar13) {
    ImVector<ImGuiWindow_*>::swap(this_00,this);
    (pIVar5->IO).MetricsActiveWindows = pIVar5->WindowsActiveCount;
    ((pIVar5->IO).Fonts)->Locked = false;
    (pIVar5->IO).MouseWheel = 0.0;
    (pIVar5->IO).MouseWheelH = 0.0;
    ImVector<unsigned_short>::resize(&(pIVar5->IO).InputQueueCharacters,0);
    (pIVar5->IO).NavInputs[0x10] = 0.0;
    (pIVar5->IO).NavInputs[0x11] = 0.0;
    (pIVar5->IO).NavInputs[0x12] = 0.0;
    (pIVar5->IO).NavInputs[0x13] = 0.0;
    (pIVar5->IO).NavInputs[0xc] = 0.0;
    (pIVar5->IO).NavInputs[0xd] = 0.0;
    (pIVar5->IO).NavInputs[0xe] = 0.0;
    (pIVar5->IO).NavInputs[0xf] = 0.0;
    (pIVar5->IO).NavInputs[8] = 0.0;
    (pIVar5->IO).NavInputs[9] = 0.0;
    (pIVar5->IO).NavInputs[10] = 0.0;
    (pIVar5->IO).NavInputs[0xb] = 0.0;
    (pIVar5->IO).NavInputs[4] = 0.0;
    (pIVar5->IO).NavInputs[5] = 0.0;
    (pIVar5->IO).NavInputs[6] = 0.0;
    (pIVar5->IO).NavInputs[7] = 0.0;
    (pIVar5->IO).NavInputs[0] = 0.0;
    (pIVar5->IO).NavInputs[1] = 0.0;
    (pIVar5->IO).NavInputs[2] = 0.0;
    (pIVar5->IO).NavInputs[3] = 0.0;
    (pIVar5->IO).NavInputs[0x14] = 0.0;
    return;
  }
  __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0x10a1,"void ImGui::EndFrame()");
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}